

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.h
# Opt level: O2

void puppup::board::print(State *state,State *other)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  array<long,_256UL> *paVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  array<long,_256UL> *paVar9;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"Score: ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  paVar9 = &state->board;
  paVar5 = &other->board;
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 0xf; lVar4 = lVar4 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"ABCDEFGHIJKLMNOPQRSTUVWXYZ"[lVar4]);
    std::operator<<(poVar3," ");
    for (lVar8 = 0; lVar8 != 0x78; lVar8 = lVar8 + 8) {
      lVar1 = *(long *)((long)paVar9->_M_elems + lVar8);
      if (lVar1 == 0x1b) {
        lVar1 = *(long *)((long)&letter_multiplier + lVar6 + lVar8);
        if (lVar1 == 3) {
          poVar3 = (ostream *)&std::cout;
          pcVar7 = "\x1b[1;104m + \x1b[0m";
        }
        else if (lVar1 == 2) {
          poVar3 = (ostream *)&std::cout;
          pcVar7 = "\x1b[1;46m + \x1b[0m";
        }
        else {
          poVar3 = (ostream *)&std::cout;
          lVar1 = *(long *)((long)&word_multiplier + lVar6 + lVar8);
          if (lVar1 == 3) {
            pcVar7 = "\x1b[1;41m + \x1b[0m";
          }
          else if (lVar1 == 2) {
            pcVar7 = "\x1b[1;45m + \x1b[0m";
          }
          else {
            pcVar7 = "\x1b[47m   \x1b[0m";
          }
        }
      }
      else {
        lVar2 = *(long *)((long)paVar9[1]._M_elems + lVar8);
        if (lVar1 == *(long *)((long)paVar5->_M_elems + lVar8)) {
          if (lVar2 == 0) {
            pcVar7 = "\x1b[1;103;31m ";
          }
          else {
            pcVar7 = "\x1b[1;103;30m ";
          }
        }
        else if (lVar2 == 0) {
          pcVar7 = "\x1b[1;33;31m ";
        }
        else {
          pcVar7 = "\x1b[1;37;40m ";
        }
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar7);
        poVar3 = std::operator<<(poVar3,"EIAONTRSULDGYWVPMHFCBZXQKJ_    +"
                                        [*(long *)((long)paVar9->_M_elems + lVar8)]);
        pcVar7 = " \x1b[0m";
      }
      std::operator<<(poVar3,pcVar7);
    }
    std::operator<<((ostream *)&std::cout,"\n");
    paVar9 = (array<long,_256UL> *)(paVar9->_M_elems + 0x10);
    paVar5 = (array<long,_256UL> *)(paVar5->_M_elems + 0x10);
    lVar6 = lVar6 + 0x80;
  }
  std::operator<<((ostream *)&std::cout," ");
  for (lVar4 = 1; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    poVar3 = std::operator<<(&std::cout,0x20);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 3;
    std::ostream::_M_insert<long>((long)poVar3);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

inline void print(const State& state, const State& other) {
    std::cout << "Score: " << state.score << std::endl;
    for (idx i = board_min; i <= board_max; ++i) {
        std::cout << ABC[i - board_min] << " ";
        for (idx j = board_min; j <= board_max; ++j) {
            if (state.board[i * 16 + j] != emptiness) {
                if (state.board[i * 16 + j] == other.board[i * 16 + j]) {
                    if (state.letter_score[i * 16 + j] == 0) {
                        std::cout << "\033[1;103;31m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    } else {
                        std::cout << "\033[1;103;30m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    }
                } else {
                    if (state.letter_score[i * 16 + j] == 0) {
                        std::cout << "\033[1;33;31m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    } else {
                        std::cout << "\033[1;37;40m "
                                  << idxSTR[state.board[i * 16 + j]]
                                  << " \033[0m";
                    }
                }
            } else {
                if (letter_multiplier[i * 16 + j] == 2) {
                    std::cout << "\033[1;46m + \033[0m";
                } else if (letter_multiplier[i * 16 + j] == 3) {
                    std::cout << "\033[1;104m + \033[0m";
                } else if (word_multiplier[i * 16 + j] == 2) {
                    std::cout << "\033[1;45m + \033[0m";
                } else if (word_multiplier[i * 16 + j] == 3) {
                    std::cout << "\033[1;41m + \033[0m";
                } else {
                    std::cout << "\033[47m   \33[0m";
                }
            }
        }
        std::cout << "\n";
    }
    std::cout << " ";
    for (idx j = board_min; j <= board_max; ++j) {
        std::cout << std::setfill(' ') << std::setw(3) << j + 1 - board_min;
    }
    std::cout << std::endl;
}